

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O0

factor * __thiscall
merlin::factor::condition
          (factor *__return_storage_ptr__,factor *this,vector<int,_std::allocator<int>_> *evidence)

{
  const_iterator ci;
  const_iterator ci_00;
  bool bVar1;
  variable_set *pvVar2;
  variable *pvVar3;
  size_t sVar4;
  reference pvVar5;
  variable vVar6;
  factor local_1b8;
  int local_154;
  undefined1 auStack_150 [4];
  int val;
  size_t local_148;
  undefined1 local_140 [8];
  variable_set vs;
  undefined8 uStack_100;
  undefined8 local_f8;
  size_t sStack_f0;
  undefined1 local_e8 [8];
  const_iterator i_1;
  variable local_c0;
  int local_ac;
  undefined1 auStack_a8 [4];
  int v;
  variable_set *pvStack_a0;
  size_t local_98;
  size_t sStack_90;
  undefined1 local_78 [8];
  const_iterator i;
  variable_set v_rem;
  vector<int,_std::allocator<int>_> *evidence_local;
  factor *this_local;
  factor *F;
  
  variable_set::variable_set((variable_set *)&i.m_tmp.m_states);
  pvVar2 = vars(this);
  variable_set::begin((const_iterator *)local_78,pvVar2);
  while( true ) {
    pvVar2 = vars(this);
    variable_set::end((const_iterator *)auStack_a8,pvVar2);
    ci.m_vs = pvStack_a0;
    ci.m_i = _auStack_a8;
    ci.m_tmp.m_label = local_98;
    ci.m_tmp.m_states = sStack_90;
    bVar1 = variable_set::const_iterator::operator!=((const_iterator *)local_78,ci);
    if (!bVar1) break;
    pvVar3 = variable_set::const_iterator::operator->((const_iterator *)local_78);
    sVar4 = variable::label(pvVar3);
    local_ac = (int)sVar4;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](evidence,(long)local_ac);
    if (-1 < *pvVar5) {
      vVar6 = variable_set::const_iterator::operator*((const_iterator *)local_78);
      local_c0 = vVar6;
      variable_set::operator|=((variable_set *)&i.m_tmp.m_states,&local_c0);
    }
    variable_set::const_iterator::operator++((const_iterator *)local_78);
  }
  i_1.m_tmp.m_states._7_1_ = 0;
  factor(__return_storage_ptr__,this);
  variable_set::begin((const_iterator *)local_e8,(variable_set *)&i.m_tmp.m_states);
  while( true ) {
    variable_set::end((const_iterator *)&vs.m_d,(variable_set *)&i.m_tmp.m_states);
    ci_00.m_vs = (variable_set *)uStack_100;
    ci_00.m_i = (size_t)vs.m_d;
    ci_00.m_tmp.m_label = local_f8;
    ci_00.m_tmp.m_states = sStack_f0;
    bVar1 = variable_set::const_iterator::operator!=((const_iterator *)local_e8,ci_00);
    if (!bVar1) break;
    vVar6 = variable_set::const_iterator::operator*((const_iterator *)local_e8);
    _auStack_150 = vVar6;
    variable_set::variable_set((variable_set *)local_140,(variable *)auStack_150);
    pvVar3 = variable_set::const_iterator::operator->((const_iterator *)local_e8);
    sVar4 = variable::label(pvVar3);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](evidence,sVar4);
    local_154 = *pvVar5;
    condition(&local_1b8,__return_storage_ptr__,(variable_set *)local_140,(long)local_154);
    operator=(__return_storage_ptr__,&local_1b8);
    ~factor(&local_1b8);
    variable_set::~variable_set((variable_set *)local_140);
    variable_set::const_iterator::operator++((const_iterator *)local_e8);
  }
  i_1.m_tmp.m_states._7_1_ = 1;
  variable_set::~variable_set((variable_set *)&i.m_tmp.m_states);
  return __return_storage_ptr__;
}

Assistant:

factor condition(std::vector<int>& evidence) const {
		variable_set v_rem;
		for (variable_set::const_iterator i = vars().begin();
				i != vars().end(); ++i) {
			int v = i->label();
			if (evidence[v] >= 0) {
				v_rem |= (*i);
			}
		}

		factor F = *this;
		for (variable_set::const_iterator i = v_rem.begin();
				i != v_rem.end(); ++i) {
			variable_set vs(*i);
			int val = evidence[i->label()];
			F = F.condition(vs, val);
		}

		return F;
	}